

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMap<int,_QTuioCursor>::insert(QMap<int,_QTuioCursor> *this,int *key,QTuioCursor *value)

{
  QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
  *pQVar1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QTuioCursor>_>,_bool> pVar2;
  QMap<int,_QTuioCursor> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
          )(QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
            *)0x0;
  }
  else {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_28.d.ptr !=
        (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
         *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                          *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pVar2 = std::map<int,QTuioCursor,std::less<int>,std::allocator<std::pair<int_const,QTuioCursor>>>
          ::insert_or_assign<QTuioCursor_const&>
                    ((map<int,QTuioCursor,std::less<int>,std::allocator<std::pair<int_const,QTuioCursor>>>
                      *)&((this->d).d.ptr)->m,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(_Base_ptr)pVar2.first._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }